

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O0

void __thiscall
brown::Tile::print6x8(Tile *this,int ox,int y,uint32_t fcol,uint32_t bcol,char *fmt,...)

{
  char cVar1;
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  uint32_t *lpx;
  uint32_t *lp;
  int x;
  int ie;
  int j;
  int i;
  char *v;
  char *c;
  char st [1024];
  va_list arglist;
  char *fmt_local;
  uint32_t bcol_local;
  uint32_t fcol_local;
  int y_local;
  int ox_local;
  Tile *this_local;
  
  if (fmt != (char *)0x0) {
    st[0x3fc] = '0';
    st[0x3fd] = '\0';
    st[0x3fe] = '\0';
    st[0x3ff] = '\0';
    st[0x3f8] = '0';
    st[0x3f9] = '\0';
    st[0x3fa] = '\0';
    st[0x3fb] = '\0';
    vsnprintf((char *)&c,0x3ff,fmt,st + 0x3f8);
    lpx = (uint32_t *)((long)(y * this->p) + this->f);
    bcol_local = y;
    for (x = 1; x < 0x100; x = x * 2) {
      if (bcol_local < (uint)this->y) {
        lp._0_4_ = ox;
        for (v = (char *)&c; *v != '\0'; v = v + 1) {
          cVar1 = *v;
          if (-(int)lp < 1) {
            local_534 = 0;
          }
          else {
            local_534 = -(int)lp;
          }
          ie = local_534;
          if (this->x - (int)lp < 6) {
            local_538 = this->x - (int)lp;
          }
          else {
            local_538 = 6;
          }
          for (; ie < local_538; ie = ie + 1) {
            if (((char)font6x8[(long)ie + (long)(cVar1 * 6)] & x) == 0) {
              lpx[(long)(int)lp + (long)ie] = bcol;
            }
            else {
              lpx[(long)(int)lp + (long)ie] = fcol;
            }
          }
          if (*v == '\t') {
            if (-(int)lp < 7) {
              local_53c = 6;
            }
            else {
              local_53c = -(int)lp;
            }
            ie = local_53c;
            if (this->x - (int)lp < 0x12) {
              local_540 = this->x - (int)lp;
            }
            else {
              local_540 = 0x12;
            }
            for (; ie < local_540; ie = ie + 1) {
              lpx[(long)(int)lp + (long)ie] = bcol;
            }
            lp._0_4_ = (int)lp + 0xc;
          }
          lp._0_4_ = (int)lp + 6;
        }
      }
      bcol_local = bcol_local + 1;
      lpx = (uint32_t *)((long)lpx + (long)this->p);
    }
  }
  return;
}

Assistant:

void Tile::print6x8 (int ox, int y, std::uint32_t fcol, std::uint32_t bcol, const char *fmt, ...)
{
    std::va_list arglist;
    char st[1024], *c, *v;
    int i, j, ie, x;
    std::uint32_t *lp, *lpx;

    if (!fmt) return;
    va_start(arglist,fmt);
    if (vsnprintf((char *)&st,sizeof(st)-1,fmt,arglist)) st[sizeof(st)-1] = 0;
    va_end(arglist);

    lp = (std::uint32_t *)(y*this->p+this->f);
    for(j=1;j<256;y++,lp=(std::uint32_t *)(((intptr_t)lp)+this->p),j+=j)
        if ((unsigned)y < (unsigned)this->y)
            for(c=st,x=ox;*c;c++,x+=6)
            {
                v = ((int)(*c))*6 + ((char *)font6x8); lpx = &lp[x];
                for(i=max(-x,0),ie=min(this->x-x,6);i<ie;i++) { if (v[i]&j) lpx[i] = fcol; else if (bcol >= 0) lpx[i] = bcol; }
                if ((*c) == 9) { if (bcol >= 0) { for(i=max(-x,6),ie=min(this->x-x,18);i<ie;i++) lpx[i] = bcol; } x += 2*6; }
            }
}